

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

void * lzham::lzham_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *pvVar1;
  char *p_msg;
  size_t actual_size;
  
  if (((ulong)p & 0xf) == 0) {
    if (size < 0x400000001) {
      pvVar1 = (void *)(*(code *)g_pRealloc)();
      if (pActual_size == (size_t *)0x0) {
        return pvVar1;
      }
      *pActual_size = size;
      return pvVar1;
    }
    p_msg = "lzham_malloc: size too big";
  }
  else {
    p_msg = "lzham_realloc: bad ptr";
  }
  lzham_mem_error(p_msg);
  return (void *)0x0;
}

Assistant:

void* lzham_realloc(void* p, size_t size, size_t* pActual_size, bool movable)
   {
      if ((ptr_bits_t)p & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error("lzham_realloc: bad ptr");
         return NULL;
      }

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error("lzham_malloc: size too big");
         return NULL;
      }

#if LZHAM_MEM_STATS
      size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
#endif

      size_t actual_size = size;
      void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

      if (pActual_size)
         *pActual_size = actual_size;

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      int num_new_blocks = 0;
      if (p)
      {
         if (!p_new)
            num_new_blocks = -1;
      }
      else if (p_new)
      {
         num_new_blocks = 1;
      }
      update_total_allocated(num_new_blocks, static_cast<mem_stat_t>(actual_size) - static_cast<mem_stat_t>(cur_size));
#endif

      return p_new;
   }